

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

double __thiscall
ProbabEstimator::getMaxProbab
          (ProbabEstimator *this,double *vecMaxs,int numReplaced,int minPathLength,int maxPathLength
          ,int pathLengthStep)

{
  int pathLength;
  double dVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 extraout_var [56];
  
  dVar1 = 0.0;
  if (minPathLength <= maxPathLength) {
    dVar1 = 0.0;
    do {
      auVar2._0_8_ = getProbabFast(this,vecMaxs,numReplaced,minPathLength);
      auVar2._8_56_ = extraout_var;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar1;
      minPathLength = minPathLength + pathLengthStep;
      auVar3 = vmaxsd_avx(auVar2._0_16_,auVar3);
      dVar1 = auVar3._0_8_;
    } while (minPathLength <= maxPathLength);
  }
  return dVar1;
}

Assistant:

double ProbabEstimator::getMaxProbab( const double *vecMaxs, const int numReplaced, const int minPathLength, const int maxPathLength, const int pathLengthStep ){
    double maxProbab = 0.0;
    for ( int pathLength = minPathLength; pathLength <= maxPathLength; pathLength += pathLengthStep ){
        double probabF = getProbabFast( vecMaxs, numReplaced, pathLength );
        #ifdef CHECK_FAST_PROBABS
        double probabS = getProbab( vecMaxs, numReplaced, pathLength );
        if ( fabs(probabF-probabS) > 1.0e-6 ) printf( "WARNING: Probabilities mismatch (%.6f %.6f).\n", probabF, probabS );
        #endif
        if ( probabF > maxProbab ) maxProbab = probabF;
    }
    return maxProbab;
}